

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringCache.h
# Opt level: O0

void __thiscall
Js::StringCache::Initialize(StringCache *this,ScriptContext *scriptContext,StaticType *staticString)

{
  StaticType *staticString_local;
  ScriptContext *scriptContext_local;
  StringCache *this_local;
  
  Memory::WriteBarrierPtr<Js::ScriptContext>::operator=(&this->scriptContext,scriptContext);
  Memory::WriteBarrierPtr<Js::StaticType>::operator=(&this->stringTypeStatic,staticString);
  return;
}

Assistant:

void Initialize(ScriptContext* scriptContext, StaticType* staticString)
    {
        this->scriptContext = scriptContext;
        this->stringTypeStatic = staticString;
    }